

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O3

void anon_unknown.dwarf_8c458::compareMat(M44f *M,M44f *N)

{
  ostream *poVar1;
  float (*pafVar2) [4];
  long lVar3;
  long lVar4;
  M44f D;
  Matrix44<float> local_70;
  
  pafVar2 = (float (*) [4])&local_70;
  Imath_2_5::Matrix44<float>::operator-(M,N);
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      if (0.0001 < ABS((*(float (*) [4])*pafVar2)[lVar4])) {
        poVar1 = std::operator<<((ostream *)&std::cout,"unexpectedly diff ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*pafVar2)[lVar4]);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar3);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar4);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar1 = Imath_2_5::operator<<(poVar1,M);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar1 = Imath_2_5::operator<<(poVar1,N);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar1 = Imath_2_5::operator<<(poVar1,&local_70);
        std::endl<char,std::char_traits<char>>(poVar1);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testMiscMatrixAlgo.cpp"
                      ,0xd8,"void (anonymous namespace)::compareMat(M44f &, M44f &)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    pafVar2 = pafVar2 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void
compareMat(M44f& M, M44f& N)
{
    float eps = 0.0001;
    
    /// Verify that the entries in M and N do not
    // differ too much.

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
        for (int k = 0; k < 4; ++k)
        {
            //cout << "diff="<<D[j][k] << endl;
            if (abs (D[j][k]) > eps)
            {
                cout << "unexpectedly diff "<<
                D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}